

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O2

bool __thiscall mp::NLSuffix::operator<(NLSuffix *this,NLSuffix *s)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_40;
  
  uVar1 = this->kind_;
  std::__cxx11::string::string((string *)&pStack_68,(string *)this);
  uVar2 = s->kind_;
  pStack_68.second = uVar1 & 3;
  std::__cxx11::string::string((string *)&local_40,(string *)s);
  local_40.second = uVar2 & 3;
  bVar3 = std::operator<(&pStack_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&pStack_68);
  return bVar3;
}

Assistant:

bool operator<(const NLSuffix& s) const {
    return std::make_pair(name_, kind_&3)
        < std::make_pair(s.name_, s.kind_&3);
  }